

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  long *plVar5;
  char *__s1;
  ostream *poVar6;
  size_type *psVar7;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  PolicyID id_03;
  PolicyID id_04;
  string compilerIdVar;
  ostringstream w;
  string local_250;
  string local_230;
  cmGlobalGenerator *local_210;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_210 = this;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "CMAKE_",lang);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_1a8);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208.field_2._8_8_ = plVar5[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_208._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar1 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  __s1 = cmMakefile::GetDefinition(mf,&local_208);
  if (__s1 == (char *)0x0) goto LAB_0018c9ac;
  iVar3 = strcmp(__s1,"AppleClang");
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0025,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1a8,(cmPolicies *)0x19,id);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_0018c97e;
        bVar2 = cmake::GetIsInTryCompile(local_210->CMakeInstance);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,"CMAKE_POLICY_WARNING_CMP0025","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x19,id_02);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_250._M_dataplus._M_p,
                              local_250._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," compiler id \"AppleClang\" to \"Clang\" for compatibility.",0x37);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_250);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      cmMakefile::AddDefinition(mf,&local_208,"Clang");
    }
  }
LAB_0018c97e:
  iVar3 = strcmp(__s1,"QCC");
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0047,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1a8,(cmPolicies *)0x2f,id_00);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1a8);
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_0018c995;
        bVar2 = cmake::GetIsInTryCompile(local_210->CMakeInstance);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CMAKE_POLICY_WARNING_CMP0047","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_250);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_230,(cmPolicies *)0x2f,id_03);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_230._M_dataplus._M_p,
                              local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," compiler id \"QCC\" to \"GNU\" for compatibility.",0x2e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      cmMakefile::AddDefinition(mf,&local_208,"GNU");
      iVar3 = std::__cxx11::string::compare((char *)lang);
      if (iVar3 == 0) {
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_COMPILER_IS_GNUCC","");
        cmMakefile::AddDefinition(mf,(string *)local_1a8,"1");
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)lang);
        if (iVar3 != 0) goto LAB_0018c995;
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_COMPILER_IS_GNUCXX","");
        cmMakefile::AddDefinition(mf,(string *)local_1a8,"1");
      }
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
LAB_0018c995:
  iVar3 = strcmp(__s1,"XLClang");
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0089,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1a8,(cmPolicies *)0x59,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_0018c9ac;
        bVar2 = cmake::GetIsInTryCompile(local_210->CMakeInstance);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,"CMAKE_POLICY_WARNING_CMP0089","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x59,id_04);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                              local_1e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," compiler id \"XLClang\" to \"XL\" for compatibility.",0x31);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      cmMakefile::AddDefinition(mf,&local_208,"XL");
    }
  }
LAB_0018c9ac:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(
  cmMakefile* mf, std::string const& lang) const
{
  std::string compilerIdVar = "CMAKE_" + lang + "_COMPILER_ID";
  const char* compilerId = mf->GetDefinition(compilerIdVar);
  if (!compilerId) {
    return;
  }

  if (strcmp(compilerId, "AppleClang") == 0) {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0025)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            " compiler id \"AppleClang\" to \"Clang\" for compatibility."
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025));
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (strcmp(compilerId, "QCC") == 0) {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0047)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            " compiler id \"QCC\" to \"GNU\" for compatibility."
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
    }
  }

  if (strcmp(compilerId, "XLClang") == 0) {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0089)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0089")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0089) << "\n"
            "Converting " << lang <<
            " compiler id \"XLClang\" to \"XL\" for compatibility."
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert XLClang to XL.
        mf->AddDefinition(compilerIdVar, "XL");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0089));
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }
}